

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_find.c
# Opt level: O2

s_linkedlist * linkedlist_find(s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg)

{
  e_matcher_result eVar1;
  s_linkedlist *linked_list_00;
  s_linkedlist_node *psVar2;
  
  psVar2 = linked_list->head;
  linked_list_00 = linkedlist_create();
  if (linked_list_00 != (s_linkedlist *)0x0) {
    for (; psVar2 != (s_linkedlist_node *)0x0; psVar2 = psVar2->next) {
      eVar1 = (*matcher)(psVar2->element,matcher_arg);
      if (eVar1 == E_MATCHER_RESULT_MATCH) {
        linkedlist_add_back(linked_list_00,psVar2->element);
      }
    }
  }
  return linked_list_00;
}

Assistant:

s_linkedlist *linkedlist_find(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg) {
    s_linkedlist_node *node               = linked_list->head;
    s_linkedlist      *linked_list_result = linkedlist_create();

    if (linked_list_result == NULL) {
        return NULL;
    }

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            linkedlist_add_back(linked_list_result, node->element);
        }

        node = node->next;
    }

    return linked_list_result;
}